

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc:132:20)>_>
::Visit<google::protobuf::DescriptorProto>
          (VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_visitor_test_cc:132:20)>_>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this_00;
  iterator __position;
  ushort *puVar1;
  EnumDescriptor *pEVar2;
  Descriptor *pDVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  long lVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  AssertHelper local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  this_00 = (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
             *)(this->visitor).super_anon_class_8_1_aac68544.descriptors;
  if (this_00 !=
      (vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
       *)0x0) {
    pcVar6 = (descriptor->all_names_).payload_;
    local_58 = (undefined1  [8])(ulong)*(ushort *)(pcVar6 + 2);
    pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pcVar6 + ~(ulong)local_58);
    __position._M_current = *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 8);
    if (__position._M_current ==
        *(basic_string_view<char,_std::char_traits<char>_> **)(this_00 + 0x10)) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                (this_00,__position,(basic_string_view<char,_std::char_traits<char>_> *)local_58);
    }
    else {
      (__position._M_current)->_M_len = (size_t)local_58;
      (__position._M_current)->_M_str = (char *)pbStack_50;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
    }
  }
  puVar1 = (ushort *)(descriptor->all_names_).payload_;
  local_40._M_len = (size_t)*puVar1;
  local_40._M_str = (char *)((long)puVar1 + ~local_40._M_len);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
            ((internal *)local_58,"message.name()","proto.name()",&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (pbStack_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = (pbStack_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc"
               ,0x75,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_40._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_40._M_len + 8))();
    }
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
  if (0 < descriptor->enum_type_count_) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      pEVar2 = descriptor->enum_types_;
      proto_00 = RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            (int)lVar7);
      Visit<google::protobuf::EnumDescriptorProto>
                ((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_visitor_test_cc:132:20)>_>
                  *)(this->visitor).super_anon_class_8_1_aac68544.descriptors,
                 (EnumDescriptor *)(&pEVar2->super_SymbolBase + lVar4),proto_00);
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x58;
    } while (lVar7 < descriptor->enum_type_count_);
  }
  if (0 < descriptor->oneof_decl_count_) {
    iVar5 = 0;
    do {
      RepeatedPtrFieldBase::
      Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 < descriptor->oneof_decl_count_);
  }
  if (0 < descriptor->field_count_) {
    iVar5 = 0;
    do {
      RepeatedPtrFieldBase::
      Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 < descriptor->field_count_);
  }
  if (0 < descriptor->nested_type_count_) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      pDVar3 = descriptor->nested_types_;
      proto_01 = RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            (int)lVar7);
      Visit<google::protobuf::DescriptorProto>
                (this,(Descriptor *)(&pDVar3->super_SymbolBase + lVar4),proto_01);
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0xa0;
    } while (lVar7 < descriptor->nested_type_count_);
  }
  if (0 < descriptor->extension_count_) {
    iVar5 = 0;
    do {
      RepeatedPtrFieldBase::
      Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 < descriptor->extension_count_);
  }
  if (0 < descriptor->extension_range_count_) {
    iVar5 = 0;
    do {
      RepeatedPtrFieldBase::
      Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                (&(proto->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 < descriptor->extension_range_count_);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }